

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void sse::Subtract(uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
                  uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
                  uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  uint8_t uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  
  if (outY != outYEnd) {
    uVar3 = (ulong)totalSimdWidth;
    puVar5 = outY + uVar3;
    puVar6 = in2Y + uVar3;
    puVar7 = in1Y + uVar3;
    do {
      if (simdWidth != 0) {
        lVar2 = 0;
        do {
          auVar1 = vpsubusb_avx(*(undefined1 (*) [16])(in1Y + lVar2),
                                *(undefined1 (*) [16])(in2Y + lVar2));
          *(undefined1 (*) [16])(outY + lVar2) = auVar1;
          lVar2 = lVar2 + 0x10;
        } while ((ulong)simdWidth << 4 != lVar2);
      }
      if (nonSimdWidth != 0) {
        uVar3 = 0;
        do {
          uVar4 = puVar7[uVar3] - puVar6[uVar3];
          if (puVar7[uVar3] < puVar6[uVar3]) {
            uVar4 = '\0';
          }
          puVar5[uVar3] = uVar4;
          uVar3 = uVar3 + 1;
        } while (nonSimdWidth != uVar3);
      }
      outY = outY + rowSizeOut;
      in1Y = in1Y + rowSizeIn1;
      in2Y = in2Y + rowSizeIn2;
      puVar5 = puVar5 + rowSizeOut;
      puVar6 = puVar6 + rowSizeIn2;
      puVar7 = puVar7 + rowSizeIn1;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void Subtract( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                   uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst ) {
                simd data = _mm_loadu_si128( src1 );
                _mm_storeu_si128( dst, _mm_sub_epi8( data, _mm_min_epu8( data, _mm_loadu_si128( src2 ) ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X ) {
                    if( (*in2X) > (*in1X) )
                        (*outX) = 0u;
                    else
                        (*outX) = static_cast<uint8_t>( (*in1X) - (*in2X) );
                }
            }
        }
    }